

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_string_utils.cpp
# Opt level: O0

void strsplit(string *str,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *ret,string *sep)

{
  size_type sVar1;
  ulong uVar2;
  long lVar3;
  string local_a0 [48];
  string local_70 [32];
  size_type local_50;
  size_type comma_pos;
  size_type pos_begin;
  string tmp;
  string *sep_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret_local;
  string *str_local;
  
  tmp.field_2._8_8_ = sep;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&pos_begin);
    comma_pos = std::__cxx11::string::find_first_not_of((string *)str,(ulong)sep);
    local_50 = 0;
    while (comma_pos != 0xffffffffffffffff) {
      local_50 = std::__cxx11::string::find((string *)str,(ulong)sep);
      if (local_50 == 0xffffffffffffffff) {
        std::__cxx11::string::substr((ulong)local_a0,(ulong)str);
        std::__cxx11::string::operator=((string *)&pos_begin,local_a0);
        std::__cxx11::string::~string(local_a0);
        comma_pos = local_50;
      }
      else {
        std::__cxx11::string::substr((ulong)local_70,(ulong)str);
        std::__cxx11::string::operator=((string *)&pos_begin,local_70);
        std::__cxx11::string::~string(local_70);
        sVar1 = local_50;
        lVar3 = std::__cxx11::string::length();
        comma_pos = sVar1 + lVar3;
      }
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(ret,(value_type *)&pos_begin);
        std::__cxx11::string::clear();
      }
    }
    std::__cxx11::string::~string((string *)&pos_begin);
  }
  return;
}

Assistant:

void strsplit(const std::string& str, std::vector<std::string>& ret, std::string sep)
{
  if (str.empty())
    return;

  std::string tmp;  
  std::string::size_type pos_begin = str.find_first_not_of(sep);  
  std::string::size_type comma_pos = 0;  

  while (pos_begin != std::string::npos) {
    comma_pos = str.find(sep, pos_begin);  
    if (comma_pos != std::string::npos) {
      tmp = str.substr(pos_begin, comma_pos - pos_begin);
      pos_begin = comma_pos + sep.length();
    }
    else {
      tmp = str.substr(pos_begin);
      pos_begin = comma_pos;
    }
    if (!tmp.empty()) {
      ret.push_back(tmp);
      tmp.clear();
    }
  }
}